

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O0

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  uint uVar1;
  U32 UVar2;
  int iVar3;
  uint *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  long in_RDI;
  void *in_R8;
  uint symbNb;
  int count;
  int max;
  uint n0;
  size_t countSize;
  char buffer [4];
  int previous0;
  uint charnum;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int nbBits;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint local_80;
  uint local_7c;
  uint local_74;
  undefined1 local_68 [4];
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint *local_48;
  long local_40;
  uint *tableLogPtr_00;
  void *local_8;
  
  local_40 = (long)in_RCX + (long)in_R8;
  local_60 = 0;
  local_64 = 0;
  if (in_R8 < (void *)0x4) {
    tableLogPtr_00 = in_RCX;
    memset(local_68,0,4);
    memcpy(local_68,tableLogPtr_00,(size_t)in_R8);
    local_8 = (void *)FSE_readNCount((short *)in_RSI,in_RDX,tableLogPtr_00,in_R8,(size_t)in_RCX);
    uVar1 = FSE_isError(0x2eff82);
    if ((uVar1 == 0) && (in_R8 < local_8)) {
      local_8 = (void *)0xfffffffffffffffc;
    }
  }
  else {
    local_48 = in_RCX;
    UVar2 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    uVar1 = (UVar2 & 0xf) + 5;
    if (uVar1 < 0x10) {
      local_58 = UVar2 >> 4;
      local_5c = 4;
      *in_RDX = uVar1;
      local_50 = (1 << (sbyte)uVar1) + 1;
      local_54 = 1 << (sbyte)uVar1;
      local_4c = (UVar2 & 0xf) + 6;
      while (1 < local_50 && local_60 <= *in_RSI) {
        if (local_64 != 0) {
          local_74 = local_60;
          while ((local_58 & 0xffff) == 0xffff) {
            local_74 = local_74 + 0x18;
            if (local_48 < (uint *)(local_40 - 5U)) {
              local_48 = (uint *)((long)local_48 + 2);
              UVar2 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                    in_stack_ffffffffffffff78));
              local_58 = UVar2 >> ((byte)local_5c & 0x1f);
            }
            else {
              local_58 = local_58 >> 0x10;
              local_5c = local_5c + 0x10;
            }
          }
          for (; (local_58 & 3) == 3; local_58 = local_58 >> 2) {
            local_74 = local_74 + 3;
            local_5c = local_5c + 2;
          }
          local_74 = (local_58 & 3) + local_74;
          local_5c = local_5c + 2;
          if (*in_RSI < local_74) {
            return 0xfffffffffffffff9;
          }
          while (local_60 < local_74) {
            *(undefined2 *)(in_RDI + (ulong)local_60 * 2) = 0;
            local_60 = local_60 + 1;
          }
          if (((uint *)(local_40 - 7U) < local_48) &&
             (local_40 - 4U < (ulong)((long)local_48 + (long)((int)local_5c >> 3)))) {
            local_58 = local_58 >> 2;
          }
          else {
            local_48 = (uint *)((long)local_48 + (long)((int)local_5c >> 3));
            local_5c = local_5c & 7;
            UVar2 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78));
            local_58 = UVar2 >> ((byte)local_5c & 0x1f);
          }
        }
        uVar1 = (local_54 * 2 + -1) - local_50;
        if ((local_58 & local_54 - 1U) < uVar1) {
          local_7c = local_58 & local_54 - 1U;
          iVar3 = local_4c + -1;
        }
        else {
          local_7c = local_58 & local_54 * 2 - 1U;
          iVar3 = local_4c;
          if (local_54 <= (int)local_7c) {
            local_7c = local_7c - uVar1;
          }
        }
        local_5c = iVar3 + local_5c;
        iVar3 = local_7c - 1;
        in_stack_ffffffffffffff7c = iVar3;
        if (iVar3 < 0) {
          in_stack_ffffffffffffff7c = -iVar3;
        }
        local_50 = local_50 - in_stack_ffffffffffffff7c;
        *(short *)(in_RDI + (ulong)local_60 * 2) = (short)iVar3;
        local_64 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
        for (; local_50 < local_54; local_54 = local_54 >> 1) {
          local_4c = local_4c + -1;
        }
        if (((uint *)(local_40 - 7U) < local_48) &&
           (local_40 - 4U < (ulong)((long)local_48 + (long)((int)local_5c >> 3)))) {
          local_5c = local_5c + (((int)local_40 + -4) - (int)local_48) * -8;
          local_48 = (uint *)(local_40 - 4);
        }
        else {
          local_48 = (uint *)((long)local_48 + (long)((int)local_5c >> 3));
          local_5c = local_5c & 7;
        }
        local_60 = local_60 + 1;
        UVar2 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        local_58 = UVar2 >> ((byte)local_5c & 0x1f);
      }
      if (local_50 == 1) {
        if ((int)local_5c < 0x21) {
          for (local_80 = local_60; local_80 <= *in_RSI; local_80 = local_80 + 1) {
            *(undefined2 *)(in_RDI + (ulong)local_80 * 2) = 0;
          }
          *in_RSI = local_60 - 1;
          local_8 = (void *)((long)local_48 + ((long)((int)(local_5c + 7) >> 3) - (long)in_RCX));
        }
        else {
          local_8 = (void *)0xfffffffffffffffc;
        }
      }
      else {
        local_8 = (void *)0xfffffffffffffffc;
      }
    }
    else {
      local_8 = (void *)0xfffffffffffffffb;
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    DEBUGLOG(5, "FSE_readNCount");

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}